

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_2.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  Pool *this;
  void *pvVar1;
  MmapArena local_290;
  NoActionMemLogger local_280 [8];
  MemContext<cookmem::MmapArena,_cookmem::NoActionMemLogger,_void> local_278;
  
  local_278.m_arena = &local_290;
  local_290.m_minSize = 0x10000;
  local_290.m_prot = 3;
  local_290.m_flag = 0x22;
  local_278.m_logger = local_280;
  this = &local_278.m_pool;
  local_278.m_pool.m_arena = local_278.m_arena;
  local_278.m_pool.m_logger = local_278.m_logger;
  memset(&local_278.m_pool.m_footprintLimit,0,0x232);
  local_278.m_pool.m_paddingByte = -0x33;
  local_278._vptr_MemContext = (_func_int **)&PTR__SimpleMemContext_00104d28;
  pvVar1 = cookmem::MemPool<cookmem::MmapArena,_cookmem::NoActionMemLogger,_void>::allocate
                     (this,100);
  pvVar1 = cookmem::MemPool<cookmem::MmapArena,_cookmem::NoActionMemLogger,_void>::reallocate
                     (this,pvVar1,1000);
  cookmem::MemPool<cookmem::MmapArena,_cookmem::NoActionMemLogger,_void>::deallocate(this,pvVar1,0);
  cookmem::MemContext<cookmem::MmapArena,_cookmem::NoActionMemLogger,_void>::~MemContext(&local_278)
  ;
  return 0;
}

Assistant:

int
main (int argc, const char* argv[])
{
    // Use default arena
    cookmem::SimpleMemContext<cookmem::MmapArena> memCtx;

    // allocate memory
    void* ptr = memCtx.allocate (100);

    // change the size of the memory
    ptr = memCtx.reallocate (ptr, 1000);

    // free the memory
    memCtx.deallocate (ptr);

    return 0;
}